

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O3

void xm_envelopes(xm_channel_context_t *ch)

{
  xm_instrument_t *pxVar1;
  float fVar2;
  
  pxVar1 = ch->instrument;
  if (pxVar1 != (xm_instrument_t *)0x0) {
    if ((pxVar1->volume_envelope).enabled == true) {
      if ((ch->sustained == false) &&
         (fVar2 = (float)pxVar1->volume_fadeout * -3.0517578e-05 + ch->fadeout_volume,
         ch->fadeout_volume = fVar2, fVar2 < 0.0)) {
        ch->fadeout_volume = 0.0;
      }
      xm_envelope_tick(ch,&pxVar1->volume_envelope,&ch->volume_envelope_frame_count,
                       &ch->volume_envelope_volume);
      pxVar1 = ch->instrument;
    }
    if ((pxVar1->panning_envelope).enabled == true) {
      xm_envelope_tick(ch,&pxVar1->panning_envelope,&ch->panning_envelope_frame_count,
                       &ch->panning_envelope_panning);
      return;
    }
  }
  return;
}

Assistant:

static void xm_envelopes(xm_channel_context_t* ch) {
	if(ch->instrument != NULL) {
		if(ch->instrument->volume_envelope.enabled) {
			if(!ch->sustained) {
				ch->fadeout_volume -= (float)ch->instrument->volume_fadeout / 32768.f;
				XM_CLAMP_DOWN(ch->fadeout_volume);
			}

			xm_envelope_tick(ch,
							 &(ch->instrument->volume_envelope),
							 &(ch->volume_envelope_frame_count),
							 &(ch->volume_envelope_volume));
		}

		if(ch->instrument->panning_envelope.enabled) {
			xm_envelope_tick(ch,
							 &(ch->instrument->panning_envelope),
							 &(ch->panning_envelope_frame_count),
							 &(ch->panning_envelope_panning));
		}
	}
}